

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<void,std::function<unsigned_int(unsigned_long)>const&>
               (_func_void_function<unsigned_int_(unsigned_long)>_ptr *param_1,
               Function_Params *params,Type_Conversions_State *t_conversions)

{
  chaiscript *this;
  Type_Conversions_State *in_RCX;
  bad_boxed_cast *anon_var_0;
  function<unsigned_int_(unsigned_long)> local_50;
  undefined8 local_30;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_void_function<unsigned_int_(unsigned_long)>_ptr *param_0_local;
  
  local_30 = 1;
  i = (size_type)t_conversions;
  t_conversions_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)param_1;
  this = (chaiscript *)Function_Params::operator[](params,0);
  boxed_cast<std::function<unsigned_int(unsigned_long)>const&>
            (&local_50,this,(Boxed_Value *)i,in_RCX);
  Catch::clara::std::function<unsigned_int_(unsigned_long)>::~function(&local_50);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }